

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

Abc_Obj_t * Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *pOrigObj)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pInit;
  NodeLag_t *pNVar4;
  Abc_Obj_t *pAVar5;
  MinRegMan_t *pMVar6;
  int iVar7;
  long lVar8;
  
  if (pOrigObj == (Abc_Obj_t *)0x0) {
    __assert_fail("pOrigObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x343,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  uVar2 = *(uint *)&pOrigObj->field_0x14;
  if ((uVar2 & 0xf) == 3) {
    __assert_fail("!Abc_ObjIsPo(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x347,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if ((uVar2 & 0xf) == 2) {
    __assert_fail("!Abc_ObjIsPi(pOrigObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x346,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
  }
  if ((pManMR->pDataArray[(uint)pOrigObj->Id].field_0x1 & 1) == 0) {
    if ((uVar2 & 0x10) == 0) {
      pInit = Abc_FlowRetime_CopyNodeToInitNtk(pOrigObj);
      pMVar6 = pManMR;
      iVar1 = pInit->Id;
      iVar7 = pManMR->sizeInitToOrig;
      if (iVar1 < iVar7) {
        pNVar4 = pManMR->pInitToOrig;
      }
      else {
        iVar3 = (int)((double)iVar1 * 1.5 + 10.0);
        pManMR->sizeInitToOrig = iVar3;
        pNVar4 = (NodeLag_t *)realloc(pMVar6->pInitToOrig,(long)iVar3 << 3);
        pMVar6 = pManMR;
        pManMR->pInitToOrig = pNVar4;
        memset(pNVar4 + iVar7,0,((long)pMVar6->sizeInitToOrig - (long)iVar7) * 8);
      }
      if (pNVar4 == (NodeLag_t *)0x0) {
        __assert_fail("pManMR->pInitToOrig",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x511,"void Abc_FlowRetime_SetInitToOrig(Abc_Obj_t *, Abc_Obj_t *)");
      }
      uVar2 = *(uint *)&pOrigObj->field_0x14 & 0xf;
      if ((uVar2 < 9) && ((0x130U >> uVar2 & 1) != 0)) {
        Abc_FlowRetime_ClearInitToOrig(pInit);
        pMVar6 = pManMR;
      }
      else {
        Abc_NtkIncrementTravId(pOrigObj->pNtk);
        uVar2 = *(uint *)&pOrigObj->field_0x14;
        iVar7 = 0;
        pAVar5 = pOrigObj;
        while( true ) {
          if ((8 < (uVar2 & 0xf)) || ((0x130U >> (uVar2 & 0xf) & 1) == 0)) goto LAB_0040d967;
          if ((pAVar5->vFanins).nSize == 0) {
            __assert_fail("Abc_ObjFaninNum(*pResult)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x6b,"int Abc_FlowRetime_ObjFirstNonLatchBox(Abc_Obj_t *, Abc_Obj_t **)")
            ;
          }
          pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
          iVar3 = Abc_NodeIsTravIdCurrent(pAVar5);
          if (iVar3 != 0) break;
          Abc_NodeSetTravIdCurrent(pAVar5);
          uVar2 = *(uint *)&pAVar5->field_0x14;
          iVar7 = iVar7 + (uint)((uVar2 & 0xf) == 8);
        }
        iVar7 = -1;
LAB_0040d967:
        pManMR->pInitToOrig[iVar1].id = pAVar5->Id;
        iVar3 = Abc_FlowRetime_GetLag(pAVar5);
        pMVar6 = pManMR;
        pManMR->pInitToOrig[iVar1].lag = iVar3 + iVar7;
      }
      pMVar6->pDataArray[(uint)pOrigObj->Id].field_1.pred = pInit;
      uVar2 = *(uint *)&pOrigObj->field_0x14 | 0x10;
      *(uint *)&pOrigObj->field_0x14 = uVar2;
    }
    else {
      pInit = pManMR->pDataArray[(uint)pOrigObj->Id].field_1.pred;
    }
    if (pInit == (Abc_Obj_t *)0x0) {
      __assert_fail("pInitObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x359,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
    }
    if ((uVar2 & 0x20) == 0) {
      for (lVar8 = 0; lVar8 < (pOrigObj->vFanins).nSize; lVar8 = lVar8 + 1) {
        pAVar5 = (Abc_Obj_t *)pOrigObj->pNtk->vObjs->pArray[(pOrigObj->vFanins).pArray[lVar8]];
        if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 5) {
          __assert_fail("!Abc_ObjIsBo( pOrigFanin )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x362,"Abc_Obj_t *Abc_FlowRetime_UpdateBackwardInit_rec(Abc_Obj_t *)");
        }
        pAVar5 = Abc_FlowRetime_UpdateBackwardInit_rec(pAVar5);
        Abc_ObjAddFanin(pInit,pAVar5);
      }
      pOrigObj->field_0x14 = pOrigObj->field_0x14 | 0x20;
    }
  }
  else {
    pInit = (Abc_Obj_t *)0x0;
  }
  return pInit;
}

Assistant:

Abc_Obj_t* Abc_FlowRetime_UpdateBackwardInit_rec( Abc_Obj_t *pOrigObj) {
  Abc_Obj_t *pOrigFanin, *pInitFanin, *pInitObj;
  int i;

  assert(pOrigObj);

  // should never reach primary IOs
  assert(!Abc_ObjIsPi(pOrigObj));
  assert(!Abc_ObjIsPo(pOrigObj));

  // skip bias nodes
  if (FTEST(pOrigObj, BIAS_NODE)) 
    return NULL;

  // does an init node already exist?
  if(!pOrigObj->fMarkA) {

    pInitObj = Abc_FlowRetime_CopyNodeToInitNtk( pOrigObj );

    Abc_FlowRetime_SetInitToOrig( pInitObj, pOrigObj );
    FDATA(pOrigObj)->pInitObj = pInitObj;

    pOrigObj->fMarkA = 1;
  } else {
    pInitObj = FDATA(pOrigObj)->pInitObj;
  }
  assert(pInitObj);
    
  // have we already connected this object?
  if (!pOrigObj->fMarkB) {

    // create and/or connect fanins
    Abc_ObjForEachFanin( pOrigObj, pOrigFanin, i ) {
      // should not reach BOs (i.e. the start of the next frame)
      // the new latch bounday should lie before it
      assert(!Abc_ObjIsBo( pOrigFanin ));
      pInitFanin = Abc_FlowRetime_UpdateBackwardInit_rec( pOrigFanin );
      Abc_ObjAddFanin( pInitObj, pInitFanin );
    }

    pOrigObj->fMarkB = 1;
  }

  return pInitObj;
}